

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idhash.c
# Opt level: O3

size_t id_find(nni_id_map *m,uint64_t id)

{
  nni_id_entry *pnVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (m->id_count != 0) {
    uVar2 = m->id_cap - 1;
    uVar3 = (ulong)((uint)id & uVar2);
    pnVar1 = m->id_entries;
    uVar4 = uVar3;
    do {
      if ((pnVar1[uVar4].key == id) && (pnVar1[uVar4].val != (void *)0x0)) {
        return uVar4;
      }
      if (pnVar1[uVar4].skips == 0) {
        return 0xffffffffffffffff;
      }
      uVar4 = (ulong)((int)uVar4 * 5 + 1U & uVar2);
    } while (uVar4 != uVar3);
  }
  return 0xffffffffffffffff;
}

Assistant:

static size_t
id_find(nni_id_map *m, uint64_t id)
{
	size_t index;
	size_t start;
	if (m->id_count == 0) {
		return ((size_t) -1);
	}

	index = ID_INDEX(m, id);
	start = index;
	for (;;) {
		// The value of ihe_key is only valid if ihe_val is not NULL.
		if ((m->id_entries[index].key == id) &&
		    (m->id_entries[index].val != NULL)) {
			return (index);
		}
		if (m->id_entries[index].skips == 0) {
			return ((size_t) -1);
		}
		index = ID_NEXT(m, index);

		if (index == start) {
			break;
		}
	}

	return ((size_t) -1);
}